

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

APlayerPawn * P_SpawnPlayer(FPlayerStart *mthing,int playernum,int flags)

{
  DWORD *pDVar1;
  player_t *player;
  double dVar2;
  byte bVar3;
  sector_t *psVar4;
  BYTE *pBVar5;
  APlayerPawn *other;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  APlayerPawn *pAVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  AInventory *pAVar13;
  DThinker *pDVar14;
  int ii;
  APlayerPawn *pAVar15;
  long lVar16;
  WORD type;
  PClassActor *type_00;
  ulong uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  TThinkerIterator<AActor> it;
  double local_70;
  DVector3 local_68;
  DAngle local_50;
  FThinkerIterator local_48;
  
  if ((7 < (uint)playernum || mthing == (FPlayerStart *)0x0) ||
     (uVar17 = (ulong)(uint)playernum, playeringame[uVar17] != true)) {
    return (APlayerPawn *)0x0;
  }
  if (consoleplayer == playernum) {
    P_PredictionLerpReset();
  }
  lVar9 = uVar17 * 0x2a0;
  player = (player_t *)(&players + uVar17 * 0x54);
  type_00 = (PClassActor *)(&DAT_00a602e0)[uVar17 * 0x54];
  if (type_00 == (PClassActor *)0x0) {
    if (PlayerClasses.Count < 2) {
      (&DAT_00a60330)[lVar9] = 0;
      uVar7 = 0;
    }
    else {
      if ((deathmatch.Value == 0) || (multiplayer == false)) {
        uVar7 = (uint)*(byte *)(SinglePlayerClass + uVar17);
      }
      else {
        puVar12 = (undefined8 *)
                  ((ulong)(((&DAT_00a602d8)[uVar17 * 0xa8] - 1 & 0x21d) * 0x18) +
                  (&DAT_00a602c8)[uVar17 * 0x54]);
        do {
          puVar11 = puVar12;
          puVar12 = (undefined8 *)*puVar11;
        } while (*(int *)(puVar11 + 1) != 0x21d);
        uVar7 = *(uint *)(puVar11[2] + 0x28);
        if ((int)uVar7 < 0) {
          uVar7 = FRandom::GenRand32(&pr_multiclasschoice);
          uVar7 = (uVar7 & 0xff) % PlayerClasses.Count;
        }
      }
      (&DAT_00a60330)[lVar9] = (char)uVar7;
      uVar7 = uVar7 & 0xff;
    }
    type_00 = *(PClassActor **)((long)&(PlayerClasses.Array)->Type + (ulong)(uVar7 << 5));
    (&DAT_00a602e0)[uVar17 * 0x54] = type_00;
  }
  if ((((((dmflags2.Value._1_1_ & 0x10) == 0) || ((&DAT_00a60298)[lVar9] != '\x02')) ||
       (deathmatch.Value != 0)) ||
      ((gameaction == ga_worlddone || (pAVar10 = player->mo, pAVar10 == (APlayerPawn *)0x0)))) ||
     ((psVar4 = (pAVar10->super_AActor).Sector, (psVar4->Flags & 8) != 0 ||
      ((&DAT_00a603c0)[uVar17 * 0x54] == 0)))) {
LAB_0055279a:
    local_68.X = (mthing->pos).X;
    local_68.Y = (mthing->pos).Y;
    local_70 = (double)(int)mthing->angle;
    if (((byte)i_compatflags2 & 1) != 0) {
      local_70 = local_70 + 0.01;
    }
    pBVar5 = (type_00->super_PClass).Defaults;
    if ((pBVar5[0x18d] & 1) == 0) {
      if ((pBVar5[400] & 0x40) == 0) {
        local_68.Z = -2147483648.0;
      }
      else {
        local_68.Z = 2147483646.0;
      }
    }
    else {
      local_68.Z = 2147483647.0;
    }
  }
  else {
    if ((*(byte *)((&DAT_00a603c0)[uVar17 * 0x54] + 0x20) & 0x20) != 0) {
      (&DAT_00a603c0)[uVar17 * 0x54] = 0;
      goto LAB_0055279a;
    }
    if (999999 < psVar4->damageamount) goto LAB_0055279a;
    local_68.Z = (pAVar10->super_AActor).__Pos.Z;
    local_68.X = (pAVar10->super_AActor).__Pos.X;
    local_68.Y = (pAVar10->super_AActor).__Pos.Y;
    local_70 = (pAVar10->super_AActor).Angles.Yaw.Degrees;
  }
  dVar18 = local_68.Z;
  pAVar10 = (APlayerPawn *)AActor::StaticSpawn(type_00,&local_68,NO_REPLACE,false);
  if ((level.flags._3_1_ & 8) != 0) {
    if ((dVar18 != -2147483648.0) || (NAN(dVar18))) {
      if ((dVar18 == 2147483647.0) && (!NAN(dVar18))) {
        dVar18 = (pAVar10->super_AActor).__Pos.Z - (mthing->pos).Z;
        goto LAB_0055288b;
      }
    }
    else {
      dVar18 = (mthing->pos).Z + (pAVar10->super_AActor).__Pos.Z;
LAB_0055288b:
      (pAVar10->super_AActor).__Pos.Z = dVar18;
    }
    P_FindFloorCeiling((AActor *)pAVar10,0xe);
  }
  (pAVar10->super_AActor).FriendPlayer = (char)playernum + '\x01';
  other = player->mo;
  player->mo = pAVar10;
  (pAVar10->super_AActor).player = player;
  bVar3 = (&DAT_00a60298)[lVar9];
  if ((bVar3 & 0xfe) == 2) {
    G_PlayerReborn(playernum);
  }
  else if (((other != (APlayerPawn *)0x0) && ((flags & 1U) == 0)) &&
          ((other->super_AActor).player == player)) {
    AActor::ObtainInventory((AActor *)pAVar10,&other->super_AActor);
    FBehavior::StaticStopMyScripts(&other->super_AActor);
  }
  puVar12 = (undefined8 *)
            ((ulong)(((&DAT_00a602d8)[uVar17 * 0xa8] - 1 & 0x1ea) * 0x18) +
            (&DAT_00a602c8)[uVar17 * 0x54]);
  do {
    puVar11 = puVar12;
    puVar12 = (undefined8 *)*puVar11;
  } while (*(int *)(puVar11 + 1) != 0x1ea);
  iVar8 = R_FindSkin(skins[*(int *)(puVar11[2] + 0x28)].name,(uint)(byte)(&DAT_00a60330)[lVar9]);
  userinfo_t::SkinNumChanged((userinfo_t *)(&DAT_00a602c8 + uVar17 * 0x54),iVar8);
  if (((pAVar10->super_AActor).flags2.Value & 0x10000) == 0) {
    R_BuildPlayerTranslation(playernum);
    (pAVar10->super_AActor).Translation = playernum | 0x10000;
  }
  (pAVar10->super_AActor).Angles.Yaw.Degrees = local_70;
  (pAVar10->super_AActor).Angles.Roll.Degrees = 0.0;
  (pAVar10->super_AActor).Angles.Pitch.Degrees = 0.0;
  (pAVar10->super_AActor).health = (&DAT_00a60328)[uVar17 * 0xa8];
  if (((pAVar10->super_AActor).flags4.Value & 0x20) == 0) {
    puVar12 = (undefined8 *)
              ((ulong)(((&DAT_00a602d8)[uVar17 * 0xa8] - 1 & 0x1ea) * 0x18) +
              (&DAT_00a602c8)[uVar17 * 0x54]);
    do {
      puVar11 = puVar12;
      puVar12 = (undefined8 *)*puVar11;
    } while (*(int *)(puVar11 + 1) != 0x1ea);
    (pAVar10->super_AActor).sprite = (WORD)skins[*(int *)(puVar11[2] + 0x28)].sprite;
  }
  *(undefined8 *)(&DAT_00a602e8 + uVar17 * 0xa8) = 0x42b4000042b40000;
  pAVar15 = player->mo;
  (&DAT_00a60408)[uVar17 * 0x54] = pAVar15;
  (&DAT_00a60298)[lVar9] = 0;
  *(undefined2 *)(&DAT_00a60380 + lVar9) = 0;
  *(undefined8 *)(&DAT_00a60394 + lVar9) = 0;
  (&DAT_00a603d0)[uVar17 * 0xa8] = 0;
  *(undefined8 *)(&DAT_00a603d8 + lVar9) = 0;
  *(undefined4 *)(&DAT_00a603e0 + lVar9) = 0;
  *(undefined8 *)(&DAT_00a603e8 + lVar9) = 0;
  *(undefined8 *)(&DAT_00a603c8 + lVar9) = 0xffffffff00000000;
  (&DAT_00a602f8)[uVar17 * 0x54] = pAVar10->ViewHeight;
  (&DAT_00a60382)[uVar17 * 0x150] = 0;
  (&DAT_00a603c0)[uVar17 * 0x54] = 0;
  *(undefined2 *)(&DAT_00a6035c + lVar9) = 0;
  *(undefined4 *)(&DAT_00a60358 + lVar9) = 0;
  *(undefined8 *)(&DAT_00a60430 + lVar9) = 0;
  *(undefined8 *)(&DAT_00a60438 + lVar9) = 0;
  APlayerPawn::ResetAirSupply(pAVar15,false);
  if (((double)(&DAT_00a60458)[uVar17 * 0x54] != 1.0) ||
     (NAN((double)(&DAT_00a60458)[uVar17 * 0x54]))) {
    (&DAT_00a60458)[uVar17 * 0x54] = 0x3ff0000000000000;
    (&DAT_00a60422)[uVar17 * 0x150] = 0;
    *(undefined8 *)(&DAT_00a60460 + lVar9) = 0;
    *(undefined8 *)(lVar9 + 0xa60468) = 0;
    (&DAT_00a602f8)[uVar17 * 0x54] = player->mo->ViewHeight;
  }
  *(undefined8 *)(&DAT_00a60418 + lVar9) = 0;
  *(undefined8 *)(&DAT_00a60448 + lVar9) = 0;
  *(undefined8 *)(&DAT_00a60450 + lVar9) = 0;
  (&DAT_00a60420)[lVar9] = 0xff;
  *(undefined8 *)(&DAT_00a60310 + lVar9) = 0;
  *(undefined8 *)(lVar9 + 0xa60318) = 0;
  puVar12 = &DAT_00a60408;
  lVar9 = 0;
  do {
    if (playeringame[lVar9] == true) {
      pAVar15 = (APlayerPawn *)*puVar12;
      if (pAVar15 == (APlayerPawn *)0x0) {
LAB_00552b15:
        pAVar15 = (APlayerPawn *)0x0;
      }
      else if (((pAVar15->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
        *puVar12 = 0;
        goto LAB_00552b15;
      }
      if (pAVar15 == other) {
        *puVar12 = pAVar10;
      }
    }
    lVar9 = lVar9 + 1;
    puVar12 = puVar12 + 0x54;
  } while (lVar9 != 8);
  if (((demoplayback != false) || (demonew == true)) && (chasedemo.Value == true)) {
    (&DAT_00a60378)[uVar17 * 0xa8] = 0x20;
  }
  if ((flags & 1U) == 0) {
    P_SetupPsprites(player,SUB41((flags & 2U) >> 1,0));
  }
  if (deathmatch.Value == 0) {
    if (multiplayer == false) {
      if ((other != (APlayerPawn *)0x0 && bVar3 == 2) && (level.flags2._2_1_ & 2) != 0)
      goto LAB_00552bda;
      goto LAB_00552b8e;
    }
    if (other == (APlayerPawn *)0x0 || bVar3 != 2) goto LAB_00552b8e;
LAB_00552bda:
    (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2c])(player->mo,other)
    ;
LAB_00552be9:
    AActor::DestroyAllInventory(&other->super_AActor);
    bVar6 = false;
  }
  else {
    (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2b])();
LAB_00552b8e:
    if (other != (APlayerPawn *)0x0) goto LAB_00552be9;
    bVar6 = true;
  }
  if ((((bVar3 & 0xfe) == 2) && ((dmflags2.Value._1_1_ & 4) != 0)) &&
     ((multiplayer != false || (alwaysapplydmflags.Value == true)))) {
    pAVar13 = AActor::GiveInventoryType
                        (&player->mo->super_AActor,
                         (PClassActor *)APowerInvulnerable::RegistrationInfo.MyClass);
    *(undefined8 *)&pAVar13->field_0x4dc = 0x69;
    *(byte *)&pAVar13->ItemFlags = (byte)pAVar13->ItemFlags | 0x20;
    pDVar1 = &(player->mo->super_AActor).effects;
    *pDVar1 = *pDVar1 | 0x20;
  }
  if ((StatusBar != (DBaseStatusBar *)0x0) &&
     ((consoleplayer == playernum ||
      (iVar8 = DBaseStatusBar::GetPlayer(StatusBar), iVar8 == playernum)))) {
    (*(StatusBar->super_DObject)._vptr_DObject[10])(StatusBar,player);
  }
  if (multiplayer == true) {
    local_50.Degrees = (pAVar10->super_AActor).Angles.Yaw.Degrees;
    AActor::Vec3Angle((DVector3 *)&local_48,(AActor *)pAVar10,20.0,&local_50,0.0,false);
    P_SpawnTeleportFog((AActor *)pAVar10,(DVector3 *)&local_48,false,true);
  }
  dVar18 = (pAVar10->super_AActor).ceilingz;
  dVar2 = (pAVar10->super_AActor).Height;
  if (dVar18 < (pAVar10->super_AActor).__Pos.Z + dVar2) {
    (pAVar10->super_AActor).__Pos.Z = dVar18 - dVar2;
  }
  if ((flags & 1U) != 0) {
    return pAVar10;
  }
  if (bVar3 != 3) {
    if (bVar3 != 0) {
      if (bVar3 != 2) {
        return pAVar10;
      }
      if (bVar6) {
        __assert_fail("oldactor != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_mobj.cpp"
                      ,0x1272,"APlayerPawn *P_SpawnPlayer(FPlayerStart *, int, int)");
      }
      FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
      pDVar14 = FThinkerIterator::Next(&local_48);
      if (pDVar14 != (DThinker *)0x0) {
        do {
          pAVar15 = (APlayerPawn *)pDVar14[8].NextThinker;
          if (pAVar15 == (APlayerPawn *)0x0) {
LAB_00552d89:
            pAVar15 = (APlayerPawn *)0x0;
          }
          else if (((pAVar15->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
            pDVar14[8].NextThinker = (DThinker *)0x0;
            goto LAB_00552d89;
          }
          if (pAVar15 == other) {
            pDVar14[8].NextThinker = (DThinker *)0x0;
          }
          pDVar14 = FThinkerIterator::Next(&local_48);
        } while (pDVar14 != (DThinker *)0x0);
      }
      if (0 < numsectors) {
        lVar9 = 0x108;
        lVar16 = 0;
        iVar8 = numsectors;
        do {
          pAVar15 = *(APlayerPawn **)((long)&sectors->planes[0].xform.xOffs + lVar9);
          if (pAVar15 == (APlayerPawn *)0x0) {
LAB_00552dde:
            pAVar15 = (APlayerPawn *)0x0;
          }
          else if (((pAVar15->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
            *(undefined8 *)((long)&sectors->planes[0].xform.xOffs + lVar9) = 0;
            goto LAB_00552dde;
          }
          if (pAVar15 == other) {
            *(undefined8 *)((long)&sectors->planes[0].xform.xOffs + lVar9) = 0;
            iVar8 = numsectors;
          }
          lVar16 = lVar16 + 1;
          lVar9 = lVar9 + 0x268;
        } while (lVar16 < iVar8);
      }
      DObject::StaticPointerSubstitution((DObject *)other,(DObject *)player->mo);
      pAVar15 = player->mo;
      iVar8 = (int)((ulong)pAVar15 >> 0x20);
      lVar9 = 0;
      do {
        auVar20._0_4_ = -(uint)(*(int *)(bodyque + lVar9) == (int)pAVar15);
        auVar20._4_4_ = -(uint)(*(int *)((long)bodyque + lVar9 * 8 + 4) == iVar8);
        auVar20._8_4_ = -(uint)(*(int *)(bodyque + lVar9 + 1) == (int)pAVar15);
        auVar20._12_4_ = -(uint)(*(int *)((long)bodyque + lVar9 * 8 + 0xc) == iVar8);
        auVar19._4_4_ = auVar20._0_4_;
        auVar19._0_4_ = auVar20._4_4_;
        auVar19._8_4_ = auVar20._12_4_;
        auVar19._12_4_ = auVar20._8_4_;
        if ((auVar19 & auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bodyque[lVar9] = &other->super_AActor;
        }
        if ((auVar19 & auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bodyque[lVar9 + 1] = &other->super_AActor;
        }
        lVar9 = lVar9 + 2;
      } while (lVar9 != 0x20);
      type = 2;
      goto LAB_00552e63;
    }
    if (savegamerestore != false) {
      return pAVar10;
    }
  }
  pAVar15 = player->mo;
  type = 4;
LAB_00552e63:
  FBehavior::StaticStartTypedScripts(type,&pAVar15->super_AActor,true,0,false);
  return pAVar10;
}

Assistant:

APlayerPawn *P_SpawnPlayer (FPlayerStart *mthing, int playernum, int flags)
{
	player_t *p;
	APlayerPawn *mobj, *oldactor;
	BYTE	  state;
	DVector3 spawn;
	DAngle SpawnAngle;

	if (mthing == NULL)
	{
		return NULL;
	}
	// not playing?
	if ((unsigned)playernum >= (unsigned)MAXPLAYERS || !playeringame[playernum])
		return NULL;

	// Old lerp data needs to go
	if (playernum == consoleplayer)
	{
		P_PredictionLerpReset();
	}

	p = &players[playernum];

	if (p->cls == NULL)
	{
		// [GRB] Pick a class from player class list
		if (PlayerClasses.Size () > 1)
		{
			int type;

			if (!deathmatch || !multiplayer)
			{
				type = SinglePlayerClass[playernum];
			}
			else
			{
				type = p->userinfo.GetPlayerClassNum();
				if (type < 0)
				{
					type = pr_multiclasschoice() % PlayerClasses.Size ();
				}
			}
			p->CurrentPlayerClass = type;
		}
		else
		{
			p->CurrentPlayerClass = 0;
		}
		p->cls = PlayerClasses[p->CurrentPlayerClass].Type;
	}

	if (( dmflags2 & DF2_SAME_SPAWN_SPOT ) &&
		( p->playerstate == PST_REBORN ) &&
		( deathmatch == false ) &&
		( gameaction != ga_worlddone ) &&
		( p->mo != NULL ) && 
		( !(p->mo->Sector->Flags & SECF_NORESPAWN) ) &&
		( NULL != p->attacker ) &&							// don't respawn on damaging floors
		( p->mo->Sector->damageamount < TELEFRAG_DAMAGE ))	// this really should be a bit smarter...
	{
		spawn = p->mo->Pos();
		SpawnAngle = p->mo->Angles.Yaw;
	}
	else
	{
		spawn.X = mthing->pos.X;
		spawn.Y = mthing->pos.Y;

		// Allow full angular precision
		SpawnAngle = (double)mthing->angle;
		if (i_compatflags2 & COMPATF2_BADANGLES)
		{
			SpawnAngle += 0.01;
		}

		if (GetDefaultByType(p->cls)->flags & MF_SPAWNCEILING)
			spawn.Z = ONCEILINGZ;
		else if (GetDefaultByType(p->cls)->flags2 & MF2_SPAWNFLOAT)
			spawn.Z = FLOATRANDZ;
		else
			spawn.Z = ONFLOORZ;
	}

	mobj = static_cast<APlayerPawn *>
		(Spawn (p->cls, spawn, NO_REPLACE));

	if (level.flags & LEVEL_USEPLAYERSTARTZ)
	{
		if (spawn.Z == ONFLOORZ)
			mobj->AddZ(mthing->pos.Z);
		else if (spawn.Z == ONCEILINGZ)
			mobj->AddZ(-mthing->pos.Z);
		P_FindFloorCeiling(mobj, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	}

	mobj->FriendPlayer = playernum + 1;	// [RH] players are their own friends
	oldactor = p->mo;
	p->mo = mobj;
	mobj->player = p;
	state = p->playerstate;
	if (state == PST_REBORN || state == PST_ENTER)
	{
		G_PlayerReborn (playernum);
	}
	else if (oldactor != NULL && oldactor->player == p && !(flags & SPF_TEMPPLAYER))
	{
		// Move the voodoo doll's inventory to the new player.
		mobj->ObtainInventory (oldactor);
		FBehavior::StaticStopMyScripts (oldactor);	// cancel all ENTER/RESPAWN scripts for the voodoo doll
	}

	// [GRB] Reset skin
	p->userinfo.SkinNumChanged(R_FindSkin (skins[p->userinfo.GetSkin()].name, p->CurrentPlayerClass));

	if (!(mobj->flags2 & MF2_DONTTRANSLATE))
	{
		// [RH] Be sure the player has the right translation
		R_BuildPlayerTranslation (playernum);

		// [RH] set color translations for player sprites
		mobj->Translation = TRANSLATION(TRANSLATION_Players,playernum);
	}

	mobj->Angles.Yaw = SpawnAngle;
	mobj->Angles.Pitch = mobj->Angles.Roll = 0.;
	mobj->health = p->health;

	// [RH] Set player sprite based on skin
	if (!(mobj->flags4 & MF4_NOSKIN))
	{
		mobj->sprite = skins[p->userinfo.GetSkin()].sprite;
	}

	p->DesiredFOV = p->FOV = 90.f;
	p->camera = p->mo;
	p->playerstate = PST_LIVE;
	p->refire = 0;
	p->damagecount = 0;
	p->bonuscount = 0;
	p->morphTics = 0;
	p->MorphedPlayerClass = 0;
	p->MorphStyle = 0;
	p->MorphExitFlash = NULL;
	p->extralight = 0;
	p->fixedcolormap = NOFIXEDCOLORMAP;
	p->fixedlightlevel = -1;
	p->viewheight = mobj->ViewHeight;
	p->inconsistant = 0;
	p->attacker = NULL;
	p->spreecount = 0;
	p->multicount = 0;
	p->lastkilltime = 0;
	p->BlendR = p->BlendG = p->BlendB = p->BlendA = 0.f;
	p->mo->ResetAirSupply(false);
	p->Uncrouch();
	p->MinPitch = p->MaxPitch = 0.;	// will be filled in by PostBeginPlay()/netcode
	p->MUSINFOactor = NULL;
	p->MUSINFOtics = -1;

	p->Vel.Zero();	// killough 10/98: initialize bobbing to 0.

	for (int ii = 0; ii < MAXPLAYERS; ++ii)
	{
		if (playeringame[ii] && players[ii].camera == oldactor)
		{
			players[ii].camera = mobj;
		}
	}

	// [RH] Allow chasecam for demo watching
	if ((demoplayback || demonew) && chasedemo)
		p->cheats = CF_CHASECAM;

	// setup gun psprite
	if (!(flags & SPF_TEMPPLAYER))
	{ // This can also start a script so don't do it for the dummy player.
		P_SetupPsprites (p, !!(flags & SPF_WEAPONFULLYUP));
	}

	if (deathmatch)
	{ // Give all cards in death match mode.
		p->mo->GiveDeathmatchInventory ();
	}
	else if ((multiplayer || (level.flags2 & LEVEL2_ALLOWRESPAWN)) && state == PST_REBORN && oldactor != NULL)
	{ // Special inventory handling for respawning in coop
		p->mo->FilterCoopRespawnInventory (oldactor);
	}
	if (oldactor != NULL)
	{ // Remove any inventory left from the old actor. Coop handles
	  // it above, but the other modes don't.
		oldactor->DestroyAllInventory();
	}
	// [BC] Handle temporary invulnerability when respawned
	if ((state == PST_REBORN || state == PST_ENTER) &&
		(dmflags2 & DF2_YES_RESPAWN_INVUL) &&
		(multiplayer || alwaysapplydmflags))
	{
		APowerup *invul = static_cast<APowerup*>(p->mo->GiveInventoryType (RUNTIME_CLASS(APowerInvulnerable)));
		invul->EffectTics = 3*TICRATE;
		invul->BlendColor = 0;			// don't mess with the view
		invul->ItemFlags |= IF_UNDROPPABLE;	// Don't drop this
		p->mo->effects |= FX_RESPAWNINVUL;	// [RH] special effect
	}

	if (StatusBar != NULL && (playernum == consoleplayer || StatusBar->GetPlayer() == playernum))
	{
		StatusBar->AttachToPlayer (p);
	}

	if (multiplayer)
	{
		P_SpawnTeleportFog(mobj, mobj->Vec3Angle(20., mobj->Angles.Yaw, 0.), false, true);
	}

	// "Fix" for one of the starts on exec.wad MAP01: If you start inside the ceiling,
	// drop down below it, even if that means sinking into the floor.
	if (mobj->Top() > mobj->ceilingz)
	{
		mobj->SetZ(mobj->ceilingz - mobj->Height, false);
	}

	// [BC] Do script stuff
	if (!(flags & SPF_TEMPPLAYER))
	{
		if (state == PST_ENTER || (state == PST_LIVE && !savegamerestore))
		{
			FBehavior::StaticStartTypedScripts (SCRIPT_Enter, p->mo, true);
		}
		else if (state == PST_REBORN)
		{
			assert (oldactor != NULL);

			// before relocating all pointers to the player all sound targets
			// pointing to the old actor have to be NULLed. Otherwise all
			// monsters who last targeted this player will wake up immediately
			// after the player has respawned.
			AActor *th;
			TThinkerIterator<AActor> it;
			while ((th = it.Next()))
			{
				if (th->LastHeard == oldactor) th->LastHeard = NULL;
			}
			for(int i = 0; i < numsectors; i++)
			{
				if (sectors[i].SoundTarget == oldactor) sectors[i].SoundTarget = NULL;
			}

			DObject::StaticPointerSubstitution (oldactor, p->mo);
			// PointerSubstitution() will also affect the bodyque, so undo that now.
			for (int ii=0; ii < BODYQUESIZE; ++ii)
				if (bodyque[ii] == p->mo)
					bodyque[ii] = oldactor;
			FBehavior::StaticStartTypedScripts (SCRIPT_Respawn, p->mo, true);
		}
	}
	return mobj;
}